

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O1

void Llb_ManClusterCompress(Llb_Mtr_t *p)

{
  int iVar1;
  long lVar2;
  
  if (p->nCols < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      if (p->pColGrps[lVar2] == (Llb_Grp_t *)0x0) {
        if (p->pColSums[lVar2] != 0) {
          __assert_fail("p->pColSums[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Cluster.c"
                        ,300,"void Llb_ManClusterCompress(Llb_Mtr_t *)");
        }
        if (p->pMatrix[lVar2] == (char *)0x0) {
          __assert_fail("p->pMatrix[i] != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Cluster.c"
                        ,0x12d,"void Llb_ManClusterCompress(Llb_Mtr_t *)");
        }
        free(p->pMatrix[lVar2]);
        p->pMatrix[lVar2] = (char *)0x0;
      }
      else {
        p->pMatrix[iVar1] = p->pMatrix[lVar2];
        p->pColGrps[iVar1] = p->pColGrps[lVar2];
        p->pColSums[iVar1] = p->pColSums[lVar2];
        iVar1 = iVar1 + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->nCols);
  }
  p->nCols = iVar1;
  return;
}

Assistant:

void Llb_ManClusterCompress( Llb_Mtr_t * p )
{
    int i, k = 0;
    for ( i = 0; i < p->nCols; i++ )
    {
        if ( p->pColGrps[i] == NULL )
        {
            assert( p->pColSums[i] == 0 );
            assert( p->pMatrix[i] != NULL );
            ABC_FREE( p->pMatrix[i] );
            continue;
        }
        p->pMatrix[k]  = p->pMatrix[i];
        p->pColGrps[k] = p->pColGrps[i];
        p->pColSums[k] = p->pColSums[i];
        k++;
    }
    p->nCols = k;
}